

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EncodingTest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  long *plVar2;
  ulong uVar3;
  long *plVar4;
  XMLCh *fileName_00;
  XMLCh *fileName;
  DOMNode *tmpNode3;
  XMLSize_t numFiles;
  XMLSize_t i;
  DOMNodeList *list;
  XMLCh tempStr [4000];
  DOMDocument *fileListDoc;
  XMLException *toCatch;
  char **argv_local;
  int argc_local;
  
  xercesc_4_0::XMLPlatformUtils::Initialize
            ((char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale,(char *)0x0,(PanicHandler *)0x0,
             (MemoryManager *)0x0);
  if (argc == 2) {
    tempStr._7992_8_ = parseFile(argv[1]);
    if ((DOMDocument *)tempStr._7992_8_ == (DOMDocument *)0x0) {
      argv_local._4_4_ = 1;
    }
    else {
      xercesc_4_0::XMLString::transcode
                ("testFile",(wchar16 *)&list,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
      plVar2 = (long *)(**(code **)(*(long *)tempStr._7992_8_ + 0x70))(tempStr._7992_8_,&list);
      uVar3 = (**(code **)(*plVar2 + 0x18))();
      for (numFiles = 0; numFiles < uVar3; numFiles = numFiles + 1) {
        gTestsRun = gTestsRun + 1;
        plVar4 = (long *)(**(code **)(*plVar2 + 0x10))(plVar2,numFiles);
        xercesc_4_0::XMLString::transcode
                  ("name",(wchar16 *)&list,3999,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
        fileName_00 = (XMLCh *)(**(code **)(*plVar4 + 0x148))(plVar4,&list);
        bVar1 = processTestFile(fileName_00);
        if (!bVar1) {
          gTestsFailed = gTestsFailed + 1;
        }
      }
      printf("Encoding Tests Results Summary: \n   %d encoding tests run.\n   %d tests passed,\n   %d tests failed\n"
             ,(ulong)(uint)gTestsRun,(ulong)(uint)(gTestsRun - gTestsFailed),
             (ulong)(uint)gTestsFailed);
      if (parser != (XercesDOMParser *)0x0) {
        (**(code **)(*(long *)parser + 8))();
      }
      parser = (XercesDOMParser *)0x0;
      argv_local._4_4_ = 0;
    }
  }
  else {
    printf("usage: %s file_name \n   where file name is the xml file specifying the list of test files."
           ,*argv);
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char ** argv) {

   //
    // Initialize the Xerces-c environment
    //
	try
    {
        XMLPlatformUtils::Initialize();
    }

    catch (const XMLException& toCatch)
    {
        fprintf(stderr, "Error during initialization of xerces-c: %s\n",
            XMLString::transcode(toCatch.getMessage()));
         return 1;
    }

    //
    // Parse the command line, which should specify exactly one file, which is an
    //   xml file containing the list of test files to be processed.
    //
    if (argc != 2) {
        printf("usage: %s file_name \n"
               "   where file name is the xml file specifying the list of test files.", argv[0]);
        return 1;
    }
    DOMDocument* fileListDoc = parseFile(argv[1]);
    if (fileListDoc == 0) return 1;


    //
    // Iterate over the list of files, running each as a test.
    //
    XMLCh tempStr[4000];
    XMLString::transcode("testFile", tempStr, 3999);
    DOMNodeList* list = fileListDoc->getElementsByTagName(tempStr);
    XMLSize_t i;
    XMLSize_t numFiles = list->getLength();
    for (i=0; i<numFiles; i++)
    {
        ++gTestsRun;
        DOMNode* tmpNode3 = list->item(i);
        XMLString::transcode("name", tempStr, 3999);
        const XMLCh* fileName = ((DOMElement*) tmpNode3)->getAttribute(tempStr);
        if (processTestFile(fileName) == false)
            ++gTestsFailed;
    };



    //
    // We are done.  Print out a summary of the results
    //
    printf("Encoding Tests Results Summary: \n"
           "   %d encoding tests run.\n"
           "   %d tests passed,\n"
           "   %d tests failed\n", gTestsRun, gTestsRun-gTestsFailed, gTestsFailed);

    delete parser;
    parser = 0;
   return 0;
}